

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryBuilder::readDylink(WasmBinaryBuilder *this,size_t payloadLen)

{
  pointer *ppNVar1;
  Module *pMVar2;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> _Var3;
  size_t sVar4;
  iterator __position;
  undefined1 auVar5 [16];
  uint32_t uVar6;
  pointer __p;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> _Var7;
  ulong uVar8;
  string local_68;
  size_t local_48;
  string_view local_40;
  
  local_40._M_str = (char *)local_40._M_len;
  local_48 = payloadLen;
  _Var7._M_head_impl = (DylinkSection *)operator_new(0x48);
  (_Var7._M_head_impl)->isLegacy = false;
  *(undefined3 *)&(_Var7._M_head_impl)->field_0x1 = 0;
  (_Var7._M_head_impl)->memorySize = 0;
  (_Var7._M_head_impl)->memoryAlignment = 0;
  (_Var7._M_head_impl)->tableSize = 0;
  *(undefined8 *)&(_Var7._M_head_impl)->tableAlignment = 0;
  *(undefined8 *)
   &((_Var7._M_head_impl)->neededDynlibs).
    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_> = 0;
  *(pointer *)((long)&(_Var7._M_head_impl)->neededDynlibs + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var7._M_head_impl)->neededDynlibs + 0x10) = (pointer)0x0;
  *(undefined8 *)&((_Var7._M_head_impl)->tail).super__Vector_base<char,_std::allocator<char>_> = 0;
  *(pointer *)((long)&(_Var7._M_head_impl)->tail + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var7._M_head_impl)->tail + 0x10) = (pointer)0x0;
  pMVar2 = this->wasm;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_40._M_str;
  local_40 = (string_view)(auVar5 << 0x40);
  _Var3._M_head_impl =
       (pMVar2->dylinkSection)._M_t.
       super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
       super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
       super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
  (pMVar2->dylinkSection)._M_t.
  super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
  super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
  super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var3._M_head_impl != (DylinkSection *)0x0) {
    std::default_delete<wasm::DylinkSection>::operator()
              ((default_delete<wasm::DylinkSection> *)&pMVar2->dylinkSection,_Var3._M_head_impl);
  }
  if ((DylinkSection *)local_40._M_len != (DylinkSection *)0x0) {
    std::default_delete<wasm::DylinkSection>::operator()
              ((default_delete<wasm::DylinkSection> *)&local_40,(DylinkSection *)local_40._M_len);
  }
  sVar4 = this->pos;
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->isLegacy = true;
  uVar6 = getU32LEB(this);
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->memorySize = uVar6;
  uVar6 = getU32LEB(this);
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->memoryAlignment = uVar6;
  uVar6 = getU32LEB(this);
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->tableSize = uVar6;
  uVar6 = getU32LEB(this);
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->tableAlignment = uVar6;
  uVar6 = getU32LEB(this);
  if (uVar6 != 0) {
    uVar8 = (ulong)uVar6;
    do {
      _Var3._M_head_impl =
           (this->wasm->dylinkSection)._M_t.
           super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
           super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
      local_40 = (string_view)getInlineString(this);
      __position._M_current = *(pointer *)((long)&(_Var3._M_head_impl)->neededDynlibs + 8);
      if (__position._M_current == *(pointer *)((long)&(_Var3._M_head_impl)->neededDynlibs + 0x10))
      {
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_realloc_insert<wasm::Name>
                  (&(_Var3._M_head_impl)->neededDynlibs,__position,(Name *)&local_40);
      }
      else {
        ((__position._M_current)->super_IString).str._M_len = local_40._M_len;
        ((__position._M_current)->super_IString).str._M_str = local_40._M_str;
        ppNVar1 = (pointer *)((long)&(_Var3._M_head_impl)->neededDynlibs + 8);
        *ppNVar1 = *ppNVar1 + 1;
      }
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if (this->pos == sVar4 + local_48) {
    return;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"bad dylink section size","");
  throwError(this,&local_68);
}

Assistant:

void WasmBinaryBuilder::readDylink(size_t payloadLen) {
  wasm.dylinkSection = std::make_unique<DylinkSection>();

  auto sectionPos = pos;

  wasm.dylinkSection->isLegacy = true;
  wasm.dylinkSection->memorySize = getU32LEB();
  wasm.dylinkSection->memoryAlignment = getU32LEB();
  wasm.dylinkSection->tableSize = getU32LEB();
  wasm.dylinkSection->tableAlignment = getU32LEB();

  size_t numNeededDynlibs = getU32LEB();
  for (size_t i = 0; i < numNeededDynlibs; ++i) {
    wasm.dylinkSection->neededDynlibs.push_back(getInlineString());
  }

  if (pos != sectionPos + payloadLen) {
    throwError("bad dylink section size");
  }
}